

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *begin_00;
  char *local_30;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_28;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == '}') {
    return begin;
  }
  pcVar3 = parse_align<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                     (begin,end,handler);
  if (pcVar3 == end) {
    return pcVar3;
  }
  cVar1 = *pcVar3;
  if (cVar1 == ' ') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_space(handler);
LAB_0011ccfa:
    pcVar3 = pcVar3 + 1;
  }
  else {
    if (cVar1 == '-') {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::on_minus(handler);
      goto LAB_0011ccfa;
    }
    if (cVar1 == '+') {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::on_plus(handler);
      goto LAB_0011ccfa;
    }
  }
  if (pcVar3 == end) {
    return pcVar3;
  }
  cVar1 = *pcVar3;
  if (cVar1 == '#') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_hash(handler);
    pcVar3 = pcVar3 + 1;
    if (pcVar3 == end) {
      return pcVar3;
    }
    cVar1 = *pcVar3;
  }
  if (cVar1 == '0') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_zero(handler);
    pcVar3 = pcVar3 + 1;
    if (pcVar3 == end) {
      return pcVar3;
    }
  }
  local_30 = parse_width<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                       (pcVar3,end,handler);
  if (local_30 == end) {
    return local_30;
  }
  if (*local_30 == '.') {
    pcVar3 = local_30 + 1;
    if (pcVar3 == end) {
LAB_0011ce23:
      local_30 = pcVar3;
      specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_error(&handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ,"missing precision specifier");
      return pcVar3;
    }
    if ((int)*pcVar3 - 0x30U < 10) {
      local_30 = pcVar3;
      uVar2 = parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                        (&local_30,end,handler);
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->super_core_format_specs).precision = uVar2;
    }
    else {
      if (*pcVar3 != '{') goto LAB_0011ce23;
      begin_00 = local_30 + 2;
      local_30 = pcVar3;
      if (begin_00 != end) {
        local_28.handler = handler;
        begin_00 = parse_arg_id<char,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                             (begin_00,end,&local_28);
      }
      pcVar3 = begin_00;
      if ((begin_00 == end) || (pcVar3 = begin_00 + 1, local_30 = pcVar3, *begin_00 != '}')) {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_error(&handler->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ,"invalid format string");
        return pcVar3;
      }
    }
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::end_precision(handler);
  }
  if ((local_30 != end) && (*local_30 != '}')) {
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_core_format_specs).type = *local_30;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}